

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O0

int Gia_ManFindFirstCommonLit(Vec_Int_t *vArr1,Vec_Int_t *vArr2,int fVerbose)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  int *piStack_58;
  int nRemoved;
  int *pStart2;
  int *pStart1;
  int *pEnd2;
  int *pEnd1;
  int *pBeg2;
  int *pBeg1;
  int fVerbose_local;
  Vec_Int_t *vArr2_local;
  Vec_Int_t *vArr1_local;
  
  piVar3 = vArr1->pArray;
  iVar1 = vArr1->nSize;
  piVar4 = vArr2->pArray;
  iVar2 = vArr2->nSize;
  piStack_58 = vArr2->pArray;
  pStart2 = vArr1->pArray;
  pEnd1 = vArr2->pArray;
  pBeg2 = vArr1->pArray;
  while( true ) {
    while( true ) {
      if (piVar3 + iVar1 <= pBeg2 || piVar4 + iVar2 <= pEnd1) {
        while (pBeg2 < piVar3 + iVar1) {
          *pStart2 = *pBeg2;
          pStart2 = pStart2 + 1;
          pBeg2 = pBeg2 + 1;
        }
        while (pEnd1 < piVar4 + iVar2) {
          *piStack_58 = *pEnd1;
          piStack_58 = piStack_58 + 1;
          pEnd1 = pEnd1 + 1;
        }
        Vec_IntShrink(vArr1,(int)((long)pStart2 - (long)vArr1->pArray >> 2));
        Vec_IntShrink(vArr2,(int)((long)piStack_58 - (long)vArr2->pArray >> 2));
        return -1;
      }
      iVar5 = Abc_Lit2Var(*pBeg2);
      iVar6 = Abc_Lit2Var(*pEnd1);
      if (iVar5 == iVar6) break;
      if (*pBeg2 < *pEnd1) {
        *pStart2 = *pBeg2;
        pStart2 = pStart2 + 1;
        pBeg2 = pBeg2 + 1;
      }
      else {
        *piStack_58 = *pEnd1;
        piStack_58 = piStack_58 + 1;
        pEnd1 = pEnd1 + 1;
      }
    }
    if (*pBeg2 != *pEnd1) break;
    pEnd1 = pEnd1 + 1;
    pBeg2 = pBeg2 + 1;
  }
  return *pBeg2;
}

Assistant:

static inline int Gia_ManFindFirstCommonLit( Vec_Int_t * vArr1, Vec_Int_t * vArr2, int fVerbose )
{
    int * pBeg1 = vArr1->pArray;
    int * pBeg2 = vArr2->pArray;
    int * pEnd1 = vArr1->pArray + vArr1->nSize;
    int * pEnd2 = vArr2->pArray + vArr2->nSize;
    int * pStart1 = vArr1->pArray;
    int * pStart2 = vArr2->pArray;
    int nRemoved = 0;
    while ( pBeg1 < pEnd1 && pBeg2 < pEnd2 )
    {
        if ( Abc_Lit2Var(*pBeg1) == Abc_Lit2Var(*pBeg2) )
        { 
            if ( *pBeg1 != *pBeg2 ) 
                return *pBeg1; 
            else
                pBeg1++, pBeg2++;
            nRemoved++;
        }
        else if ( *pBeg1 < *pBeg2 )
            *pStart1++ = *pBeg1++;
        else 
            *pStart2++ = *pBeg2++;
    }
    while ( pBeg1 < pEnd1 )
        *pStart1++ = *pBeg1++;
    while ( pBeg2 < pEnd2 )
        *pStart2++ = *pBeg2++;
    Vec_IntShrink( vArr1, pStart1 - vArr1->pArray );
    Vec_IntShrink( vArr2, pStart2 - vArr2->pArray );
    //if ( fVerbose ) printf( "Removed %d duplicated entries.  Array1 = %d.  Array2 = %d.\n", nRemoved, Vec_IntSize(vArr1), Vec_IntSize(vArr2) );
    return -1;
}